

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

void __thiscall Assimp::Importer::~Importer(Importer *this)

{
  pointer ppBVar1;
  BaseProcess *pBVar2;
  aiScene *this_00;
  SharedPostProcessInfo *this_01;
  ImporterPimpl *pIVar3;
  uint uVar4;
  
  DeleteImporterInstanceList(&this->pimpl->mImporter);
  uVar4 = 0;
  while( true ) {
    pIVar3 = this->pimpl;
    ppBVar1 = (pIVar3->mPostProcessingSteps).
              super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pIVar3->mPostProcessingSteps).
                      super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <=
        (ulong)uVar4) break;
    pBVar2 = ppBVar1[uVar4];
    if (pBVar2 != (BaseProcess *)0x0) {
      (*pBVar2->_vptr_BaseProcess[1])();
    }
    uVar4 = uVar4 + 1;
  }
  if (pIVar3->mIOHandler != (IOSystem *)0x0) {
    (*pIVar3->mIOHandler->_vptr_IOSystem[1])();
    pIVar3 = this->pimpl;
  }
  if (pIVar3->mProgressHandler != (ProgressHandler *)0x0) {
    (*pIVar3->mProgressHandler->_vptr_ProgressHandler[1])();
    pIVar3 = this->pimpl;
  }
  this_00 = pIVar3->mScene;
  if (this_00 != (aiScene *)0x0) {
    aiScene::~aiScene(this_00);
  }
  operator_delete(this_00);
  this_01 = this->pimpl->mPPShared;
  if (this_01 != (SharedPostProcessInfo *)0x0) {
    SharedPostProcessInfo::~SharedPostProcessInfo(this_01);
  }
  operator_delete(this_01);
  pIVar3 = this->pimpl;
  if (pIVar3 != (ImporterPimpl *)0x0) {
    ImporterPimpl::~ImporterPimpl(pIVar3);
  }
  operator_delete(pIVar3);
  return;
}

Assistant:

Importer::~Importer()
{
    // Delete all import plugins
	DeleteImporterInstanceList(pimpl->mImporter);

    // Delete all post-processing plug-ins
    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++)
        delete pimpl->mPostProcessingSteps[a];

    // Delete the assigned IO and progress handler
    delete pimpl->mIOHandler;
    delete pimpl->mProgressHandler;

    // Kill imported scene. Destructor's should do that recursively
    delete pimpl->mScene;

    // Delete shared post-processing data
    delete pimpl->mPPShared;

    // and finally the pimpl itself
    delete pimpl;
}